

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O0

bool __thiscall S2Loop::MayIntersect(S2Loop *this,S2Cell *target)

{
  bool bVar1;
  S2Point local_a8;
  uint64 local_90;
  S2CellId local_88;
  undefined4 local_80;
  uint64 local_6c;
  CellRelation local_64;
  undefined1 local_60 [4];
  CellRelation relation;
  Iterator it;
  S2Cell *target_local;
  S2Loop *this_local;
  
  it.end_._8_8_ = target;
  MutableS2ShapeIndex::Iterator::Iterator((Iterator *)local_60,&this->index_,UNPOSITIONED);
  local_6c = (uint64)S2Cell::id((S2Cell *)it.end_._8_8_);
  local_64 = MutableS2ShapeIndex::Iterator::Locate((Iterator *)local_60,(S2CellId)local_6c);
  if (local_64 == DISJOINT) {
    this_local._7_1_ = false;
  }
  else if (local_64 == SUBDIVIDED) {
    this_local._7_1_ = true;
  }
  else {
    local_88 = S2ShapeIndex::IteratorBase::id((IteratorBase *)local_60);
    local_90 = (uint64)S2Cell::id((S2Cell *)it.end_._8_8_);
    bVar1 = ::operator==(local_88,(S2CellId)local_90);
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      bVar1 = BoundaryApproxIntersects(this,(Iterator *)local_60,(S2Cell *)it.end_._8_8_);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        S2Cell::GetCenter(&local_a8,(S2Cell *)it.end_._8_8_);
        this_local._7_1_ = Contains(this,(Iterator *)local_60,&local_a8);
      }
    }
  }
  local_80 = 1;
  MutableS2ShapeIndex::Iterator::~Iterator((Iterator *)local_60);
  return this_local._7_1_;
}

Assistant:

bool S2Loop::MayIntersect(const S2Cell& target) const {
  MutableS2ShapeIndex::Iterator it(&index_);
  S2ShapeIndex::CellRelation relation = it.Locate(target.id());

  // If "target" does not overlap any index cell, there is no intersection.
  if (relation == S2ShapeIndex::DISJOINT) return false;

  // If "target" is subdivided into one or more index cells, there is an
  // intersection to within the S2ShapeIndex error bound (see Contains).
  if (relation == S2ShapeIndex::SUBDIVIDED) return true;

  // If "target" is an index cell, there is an intersection because index cells
  // are created only if they have at least one edge or they are entirely
  // contained by the loop.
  if (it.id() == target.id()) return true;

  // Otherwise check if any edges intersect "target".
  if (BoundaryApproxIntersects(it, target)) return true;

  // Otherwise check if the loop contains the center of "target".
  return Contains(it, target.GetCenter());
}